

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rune * nk_textedit_createundo(nk_text_undo_state *state,int pos,int insert_len,int delete_len)

{
  nk_text_undo_record *pnVar1;
  nk_text_undo_record *r;
  int delete_len_local;
  int insert_len_local;
  int pos_local;
  nk_text_undo_state *state_local;
  
  pnVar1 = nk_textedit_create_undo_record(state,insert_len);
  if (pnVar1 == (nk_text_undo_record *)0x0) {
    state_local = (nk_text_undo_state *)0x0;
  }
  else {
    pnVar1->where = pos;
    pnVar1->insert_length = (short)insert_len;
    pnVar1->delete_length = (short)delete_len;
    if (insert_len == 0) {
      pnVar1->char_storage = -1;
      state_local = (nk_text_undo_state *)0x0;
    }
    else {
      pnVar1->char_storage = state->undo_char_point;
      state->undo_char_point = state->undo_char_point + (short)insert_len;
      state_local = (nk_text_undo_state *)(state->undo_char + pnVar1->char_storage);
    }
  }
  return (nk_rune *)state_local;
}

Assistant:

NK_INTERN nk_rune*
nk_textedit_createundo(struct nk_text_undo_state *state, int pos,
    int insert_len, int delete_len)
{
    struct nk_text_undo_record *r = nk_textedit_create_undo_record(state, insert_len);
    if (r == 0)
        return 0;

    r->where = pos;
    r->insert_length = (short) insert_len;
    r->delete_length = (short) delete_len;

    if (insert_len == 0) {
        r->char_storage = -1;
        return 0;
    } else {
        r->char_storage = state->undo_char_point;
        state->undo_char_point = (short)(state->undo_char_point +  insert_len);
        return &state->undo_char[r->char_storage];
    }
}